

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.hpp
# Opt level: O2

Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>
__thiscall Kernel::PolyNf::wrapPoly<Kernel::NumTraits<Kernel::RealConstantType>>(PolyNf *this)

{
  DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
  *pDVar1;
  PolyNfSuper *pPVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *in_RDX;
  Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *extraout_RDX;
  DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
  *in_RSI;
  Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>
  PVar6;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> local_50;
  DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
  local_30;
  
  if ((undefined1  [24])
      ((undefined1  [24])
       (in_RSI->
       super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
       ).
       super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
      & (undefined1  [24])0x3) == (undefined1  [24])0x2) {
    pDVar1 = &in_RSI->
              super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
    ;
    cVar3 = (pDVar1->
            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
            )._content[2];
    cVar4 = (pDVar1->
            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
            )._content[3];
    cVar5 = (pDVar1->
            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
            )._content[4];
    pPVar2 = &this->super_PolyNfSuper;
    (pPVar2->_inner).
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
    .
    super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
    .field_0x0 = (pDVar1->
                 super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                 )._content[1];
    (pPVar2->_inner).
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
    .
    super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
    ._content[0] = cVar3;
    (pPVar2->_inner).
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
    .
    super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
    ._content[1] = cVar4;
    (pPVar2->_inner).
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
    .
    super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
    ._content[2] = cVar5;
    *(undefined8 *)
     ((this->super_PolyNfSuper)._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
      .
      super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
      ._content + 7) =
         *(undefined8 *)
          ((in_RSI->
           super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
           ).
           super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
           ._content + 9);
  }
  else {
    Lib::CoproductImpl::TrivialOperations::CopyCons::
    DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
    ::DefaultImpl(&local_30,in_RSI);
    Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>::Polynom
              ((Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *)&local_50,
               (PolyNf *)&local_30);
    Lib::
    perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>>,Lib::PerfectIdComparison>
              ((Lib *)this,(Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *)&local_50);
    Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>::~Stack(&local_50);
    in_RDX = extraout_RDX;
  }
  PVar6._ptr = in_RDX;
  PVar6._0_8_ = this;
  return PVar6;
}

Assistant:

Perfect<Polynom<Number>> PolyNf::wrapPoly() const
{
  if (this->is<AnyPoly>()) {
    return this->unwrap<AnyPoly>()
            .unwrap<Perfect<Polynom<Number>>>();
  } else {
    return perfect(Polynom<Number>(*this));
  }
}